

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  Texture2DFilteringCase *this_00;
  RenderContext *pRVar2;
  ContextInfo *pCVar3;
  char *pcVar4;
  ulong uVar5;
  TextureCubeFilteringCase *this_01;
  allocator<char> local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string name_1;
  int size_1;
  int format_1;
  int wrapMode_1;
  int magFilter_1;
  int minFilter_1;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string name;
  int local_58;
  int size;
  int format;
  int wrapMode;
  int magFilter;
  int minFilter;
  TestCaseGroup *groupCube;
  TestCaseGroup *group2D;
  TextureFilteringTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  wrapMode = 0;
  uVar5 = extraout_RAX;
  while (wrapMode < 6) {
    for (format = 0; format < 2; format = format + 1) {
      for (size = 0; size < 3; size = size + 1) {
        for (local_58 = 0; local_58 < 1; local_58 = local_58 + 1) {
          for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
              name.field_2._12_4_ = name.field_2._12_4_ + 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
            std::operator+(&local_180,&local_1a0,init::minFilterModes[wrapMode].name);
            std::operator+(&local_160,&local_180,"_");
            std::operator+(&local_140,&local_160,init::magFilterModes[format].name);
            std::operator+(&local_120,&local_140,"_");
            std::operator+(&local_100,&local_120,init::wrapModes[size].name);
            std::operator+(&local_e0,&local_100,"_");
            std::operator+(&local_c0,&local_e0,init::formats[local_58].name);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&minFilter_1,"_",(allocator<char> *)((long)&magFilter_1 + 3));
            std::operator+(&local_a0,&local_c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &minFilter_1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,&local_a0,init::sizes2D[(int)name.field_2._12_4_].name);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&minFilter_1);
            std::allocator<char>::~allocator((allocator<char> *)((long)&magFilter_1 + 3));
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator(&local_1a1);
            this_00 = (Texture2DFilteringCase *)operator_new(0x128);
            pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar2 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            pCVar3 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            Texture2DFilteringCase::Texture2DFilteringCase
                      (this_00,pTVar1,pRVar2,pCVar3,pcVar4,"",init::minFilterModes[wrapMode].mode,
                       init::magFilterModes[format].mode,init::wrapModes[size].mode,
                       init::wrapModes[size].mode,init::formats[local_58].format,
                       init::sizes2D[(int)name.field_2._12_4_].width,
                       init::sizes2D[(int)name.field_2._12_4_].height);
            tcu::TestNode::addChild(node,(TestNode *)this_00);
            std::__cxx11::string::~string((string *)local_80);
          }
        }
      }
    }
    wrapMode = wrapMode + 1;
    uVar5 = (ulong)(uint)wrapMode;
  }
  wrapMode_1 = 0;
  while (wrapMode_1 < 6) {
    for (format_1 = 0; format_1 < 2; format_1 = format_1 + 1) {
      for (size_1 = 0; size_1 < 3; size_1 = size_1 + 1) {
        for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 1;
            name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
          for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 2;
              name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"",&local_321);
            std::operator+(&local_300,&local_320,init::minFilterModes[wrapMode_1].name);
            std::operator+(&local_2e0,&local_300,"_");
            std::operator+(&local_2c0,&local_2e0,init::magFilterModes[format_1].name);
            std::operator+(&local_2a0,&local_2c0,"_");
            std::operator+(&local_280,&local_2a0,init::wrapModes[size_1].name);
            std::operator+(&local_260,&local_280,"_");
            std::operator+(&local_240,&local_260,init::formats[(int)name_1.field_2._12_4_].name);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"_",&local_349);
            std::operator+(&local_220,&local_240,&local_348);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_200,&local_220,init::sizesCube[(int)name_1.field_2._8_4_].name);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_348);
            std::allocator<char>::~allocator(&local_349);
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_260);
            std::__cxx11::string::~string((string *)&local_280);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::~string((string *)&local_320);
            std::allocator<char>::~allocator(&local_321);
            this_01 = (TextureCubeFilteringCase *)operator_new(0x128);
            pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar2 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            pCVar3 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            TextureCubeFilteringCase::TextureCubeFilteringCase
                      (this_01,pTVar1,pRVar2,pCVar3,pcVar4,"",init::minFilterModes[wrapMode_1].mode,
                       init::magFilterModes[format_1].mode,init::wrapModes[size_1].mode,
                       init::wrapModes[size_1].mode,false,
                       init::formats[(int)name_1.field_2._12_4_].format,
                       init::sizesCube[(int)name_1.field_2._8_4_].width,
                       init::sizesCube[(int)name_1.field_2._8_4_].height);
            tcu::TestNode::addChild(node_00,(TestNode *)this_01);
            std::__cxx11::string::~string((string *)local_200);
          }
        }
      }
    }
    wrapMode_1 = wrapMode_1 + 1;
    uVar5 = (ulong)(uint)wrapMode_1;
  }
  return (int)uVar5;
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
	} formats[] =
	{
		{ "rgba8",		GL_RGBA8 }
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 false,
															 formats[format].format,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}